

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

bool __thiscall
HighsDomain::ConflictSet::explainBoundChangeGeq
          (ConflictSet *this,
          set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
          *currentFrontier,LocalDomChg *domchg,HighsInt *inds,double *vals,HighsInt len,double rhs,
          double maxAct)

{
  int col;
  pointer pRVar1;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var2;
  HighsMipSolver *pHVar3;
  HighsCDouble M_00;
  bool bVar4;
  const_iterator cVar5;
  pointer pdVar6;
  HighsInt *pHVar7;
  NodeSetArray *pNVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  HighsCDouble M;
  double local_d0;
  double local_c8;
  double local_c0;
  HighsCDouble local_a0;
  _Base_ptr local_90;
  HighsInt *local_88;
  value_type local_80;
  NodeSetArray *local_60;
  NodeSetArray *local_58;
  vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
  *local_50;
  key_type local_48;
  
  if (INFINITY <= maxAct) {
    return false;
  }
  local_50 = &this->resolveBuffer;
  local_88 = inds;
  std::
  vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
  ::reserve(local_50,(long)len);
  pRVar1 = (this->resolveBuffer).
           super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->resolveBuffer).
      super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
      ._M_impl.super__Vector_impl_data._M_finish != pRVar1) {
    (this->resolveBuffer).
    super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
    ._M_impl.super__Vector_impl_data._M_finish = pRVar1;
  }
  _Var2._M_head_impl =
       (this->localdom->mipsolver->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  local_a0.lo = 0.0;
  local_60 = (NodeSetArray *)((long)&(_Var2._M_head_impl)->nodequeue + 0x40);
  local_58 = (NodeSetArray *)((long)&(_Var2._M_head_impl)->nodequeue + 0x48);
  uVar12 = 0;
  uVar11 = (ulong)(uint)len;
  if (len < 1) {
    uVar11 = uVar12;
  }
  local_90 = &(currentFrontier->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_c0 = 0.0;
  dVar13 = 0.0;
  pHVar7 = local_88;
  local_d0 = maxAct;
  local_a0.hi = maxAct;
  do {
    if (uVar11 == uVar12) {
      if ((dVar13 != 0.0) || (NAN(dVar13))) {
        pdqsort<__gnu_cxx::__normal_iterator<HighsDomain::ConflictSet::ResolveCandidate*,std::vector<HighsDomain::ConflictSet::ResolveCandidate,std::allocator<HighsDomain::ConflictSet::ResolveCandidate>>>,std::less<HighsDomain::ConflictSet::ResolveCandidate>>
                  ((this->resolveBuffer).
                   super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (this->resolveBuffer).
                   super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        dVar15 = (domchg->domchg).boundval;
        pHVar3 = this->localdom->mipsolver;
        lVar10 = (long)(domchg->domchg).column;
        _Var2._M_head_impl =
             (pHVar3->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
        if ((pHVar3->model_->integrality_).
            super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10] == kContinuous) {
          dVar14 = (_Var2._M_head_impl)->epsilon;
        }
        else {
          dVar14 = (_Var2._M_head_impl)->feastol * -10.0 + 1.0;
        }
        if ((domchg->domchg).boundtype == kLower) {
          dVar15 = dVar15 - dVar14;
        }
        else {
          dVar15 = dVar15 + dVar14;
        }
        lVar9 = 800;
        if (dVar13 < 0.0) {
          lVar9 = 0x308;
        }
        HighsCDouble::operator-=
                  (&local_a0,
                   dVar13 * *(double *)
                             (*(long *)((long)&(this->globaldom->changedcolsflags_).
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start + lVar9) +
                             lVar10 * 8));
        M_00.lo = local_a0.lo;
        M_00.hi = local_a0.hi;
        bVar4 = resolveLinearGeq(this,M_00,rhs - dVar15 * dVar13,vals);
      }
      else {
        bVar4 = false;
      }
      return bVar4;
    }
    col = pHVar7[uVar12];
    lVar10 = (long)col;
    if (col == (domchg->domchg).column) {
      dVar13 = vals[uVar12];
    }
    else {
      local_80.valuePos = (HighsInt)uVar12;
      if (vals[uVar12] <= 0.0) {
        local_c8 = getColLowerPos(this->localdom,col,domchg->pos,&local_80.boundPos);
        pHVar7 = local_88;
        if (local_80.boundPos != -1 &&
            (this->globaldom->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar10] < local_c8) {
          local_48.pos = local_80.boundPos;
          local_48.domchg.boundval = 0.0;
          local_48.domchg.column = 0;
          local_48.domchg.boundtype = kLower;
          cVar5 = std::
                  _Rb_tree<HighsDomain::ConflictSet::LocalDomChg,_HighsDomain::ConflictSet::LocalDomChg,_std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                  ::find(&currentFrontier->_M_t,&local_48);
          if (cVar5._M_node == local_90) {
            pdVar6 = (this->globaldom->col_lower_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_80.baseBound = pdVar6[lVar10];
          }
          else {
            local_80.baseBound = (double)cVar5._M_node[1]._M_parent;
            pdVar6 = (this->globaldom->col_lower_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar15 = pdVar6[lVar10];
            if ((local_80.baseBound != dVar15) || (NAN(local_80.baseBound) || NAN(dVar15))) {
              dVar15 = (local_80.baseBound - dVar15) * vals[uVar12];
              local_a0.hi = local_d0 + dVar15;
              local_c0 = local_c0 +
                         (local_d0 - (local_a0.hi - dVar15)) +
                         (dVar15 - (local_a0.hi - (local_a0.hi - dVar15)));
              local_d0 = local_a0.hi;
              local_a0.lo = local_c0;
            }
            pHVar7 = local_88;
            if (local_c8 <= local_80.baseBound) goto LAB_002a6191;
          }
          dVar15 = vals[uVar12];
          local_80.delta = (local_c8 - local_80.baseBound) * dVar15;
          pNVar8 = local_60;
          goto LAB_002a613f;
        }
      }
      else {
        local_c8 = getColUpperPos(this->localdom,col,domchg->pos,&local_80.boundPos);
        pHVar7 = local_88;
        if (local_80.boundPos != -1 &&
            local_c8 <
            (this->globaldom->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar10]) {
          local_48.pos = local_80.boundPos;
          local_48.domchg.boundval = 0.0;
          local_48.domchg.column = 0;
          local_48.domchg.boundtype = kLower;
          cVar5 = std::
                  _Rb_tree<HighsDomain::ConflictSet::LocalDomChg,_HighsDomain::ConflictSet::LocalDomChg,_std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                  ::find(&currentFrontier->_M_t,&local_48);
          if (cVar5._M_node == local_90) {
            pdVar6 = (this->globaldom->col_upper_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_80.baseBound = pdVar6[lVar10];
          }
          else {
            local_80.baseBound = (double)cVar5._M_node[1]._M_parent;
            pdVar6 = (this->globaldom->col_upper_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar15 = pdVar6[lVar10];
            if ((local_80.baseBound != dVar15) || (NAN(local_80.baseBound) || NAN(dVar15))) {
              dVar15 = (local_80.baseBound - dVar15) * vals[uVar12];
              local_a0.hi = local_d0 + dVar15;
              local_c0 = local_c0 +
                         (local_d0 - (local_a0.hi - dVar15)) +
                         (dVar15 - (local_a0.hi - (local_a0.hi - dVar15)));
              local_d0 = local_a0.hi;
              local_a0.lo = local_c0;
            }
            pHVar7 = local_88;
            if (local_80.baseBound <= local_c8) goto LAB_002a6191;
          }
          dVar15 = vals[uVar12];
          local_80.delta = (local_c8 - local_80.baseBound) * dVar15;
          pNVar8 = local_58;
LAB_002a613f:
          local_80.prio =
               ABS((double)(*(long *)((long)pNVar8->_M_t + 0x30 + lVar10 * 0x38) + 1) *
                   (local_c8 - pdVar6[lVar10]) * dVar15);
          std::
          vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
          ::push_back(local_50,&local_80);
          pHVar7 = local_88;
        }
      }
    }
LAB_002a6191:
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

bool HighsDomain::ConflictSet::explainBoundChangeGeq(
    const std::set<LocalDomChg>& currentFrontier, const LocalDomChg& domchg,
    const HighsInt* inds, const double* vals, HighsInt len, double rhs,
    double maxAct) {
  if (maxAct == kHighsInf) return false;

  // get the coefficient value of the column for which we want to explain
  // the bound change
  double domchgVal = 0;

  resolveBuffer.reserve(len);
  resolveBuffer.clear();
  const auto& nodequeue = localdom.mipsolver->mipdata_->nodequeue;
  HighsCDouble M = maxAct;
  for (HighsInt i = 0; i < len; ++i) {
    HighsInt col = inds[i];

    if (col == domchg.domchg.column) {
      domchgVal = vals[i];
      continue;
    }

    ResolveCandidate cand;
    cand.valuePos = i;

    if (vals[i] > 0) {
      double ub = localdom.getColUpperPos(col, domchg.pos, cand.boundPos);
      if (globaldom.col_upper_[col] <= ub || cand.boundPos == -1) continue;
      auto it =
          currentFrontier.find(LocalDomChg{cand.boundPos, HighsDomainChange()});
      if (it != currentFrontier.end()) {
        cand.baseBound = it->domchg.boundval;
        if (cand.baseBound != globaldom.col_upper_[col])
          M += vals[i] * (cand.baseBound - globaldom.col_upper_[col]);
        if (cand.baseBound <= ub) continue;
      } else
        cand.baseBound = globaldom.col_upper_[col];

      cand.delta = vals[i] * (ub - cand.baseBound);
      cand.prio = computePrio(vals[i], ub, globaldom.col_upper_[col],
                              nodequeue.numNodesDown(col));
    } else {
      double lb = localdom.getColLowerPos(col, domchg.pos, cand.boundPos);
      if (globaldom.col_lower_[col] >= lb || cand.boundPos == -1) continue;
      auto it =
          currentFrontier.find(LocalDomChg{cand.boundPos, HighsDomainChange()});

      if (it != currentFrontier.end()) {
        cand.baseBound = it->domchg.boundval;
        if (cand.baseBound != globaldom.col_lower_[col])
          M += vals[i] * (cand.baseBound - globaldom.col_lower_[col]);
        if (cand.baseBound >= lb) continue;
      } else
        cand.baseBound = globaldom.col_lower_[col];

      cand.delta = vals[i] * (lb - cand.baseBound);
      cand.prio = computePrio(vals[i], lb, globaldom.col_lower_[col],
                              nodequeue.numNodesUp(col));
    }

    resolveBuffer.push_back(cand);
  }

  if (domchgVal == 0) return false;

  pdqsort(resolveBuffer.begin(), resolveBuffer.end());

  // to explain the bound change we start from the bound constraint,
  // multiply it by the columns coefficient in the constraint. Then the
  // bound constraint is a0 * x0 >= b0 and the constraint
  // a0 * x0 + \sum ai * xi >= b. Let the max activity of \sum ai xi be M,
  // then the constraint yields the bound a0 * x0 >= b - M. If M is
  // sufficiently small the bound constraint is implied. Therefore we
  // decrease M by updating it with the stronger local bounds until
  // M <= b - b0 holds.
  double b0 = domchg.domchg.boundval;
  if (localdom.mipsolver->variableType(domchg.domchg.column) !=
      HighsVarType::kContinuous) {
    // in case of an integral variable the bound was rounded and can be
    // relaxed by 1-feastol. We use 1 - 10 * feastol for numerical safety.
    if (domchg.domchg.boundtype == HighsBoundType::kLower)
      b0 -= (1.0 - 10 * localdom.mipsolver->mipdata_->feastol);
    else
      b0 += (1.0 - 10 * localdom.mipsolver->mipdata_->feastol);
  } else {
    // for a continuous variable we relax the bound by epsilon to
    // accommodate for tiny rounding errors
    if (domchg.domchg.boundtype == HighsBoundType::kLower)
      b0 -= localdom.mipsolver->mipdata_->epsilon;
    else
      b0 += localdom.mipsolver->mipdata_->epsilon;
  }

  // now multiply the bound constraint with the coefficient value in the
  // constraint to obtain b0
  b0 *= domchgVal;

  // compute the lower bound of M that is necessary
  double Mupper = rhs - b0;

  // M is the current residual activity initially
  if (domchgVal < 0)
    M -= domchgVal * globaldom.col_lower_[domchg.domchg.column];
  else
    M -= domchgVal * globaldom.col_upper_[domchg.domchg.column];

  return resolveLinearGeq(M, Mupper, vals);
}